

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O1

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_mu *mu;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  nsync_time abs_deadline;
  
  mu = &q->mu;
  uVar3 = 0;
  do {
    nsync_mu_lock(mu);
    abs_deadline.tv_nsec = 999999999;
    abs_deadline.tv_sec = 0x7fffffffffffffff;
    iVar1 = nsync_mu_wait_with_deadline
                      (mu,mu_queue_non_empty,q,(_func_int_void_ptr_void_ptr *)0x0,abs_deadline,
                       (nsync_note)0x0);
    pvVar5 = (void *)0x0;
    if (iVar1 == 0) {
      if (q->count == 0) {
        testing_panic("q->count == 0");
      }
      iVar1 = q->pos;
      pvVar5 = q->data[iVar1];
      q->data[iVar1] = (void *)0x0;
      q->pos = iVar1 + 1;
      q->count = q->count + -1;
      if (iVar1 + 1 == q->limit) {
        q->pos = 0;
      }
    }
    nsync_mu_unlock(mu);
    if (pvVar5 == (void *)0x0) {
      pcVar2 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/mu_wait_test.c"
                     ,0x80,pcVar2);
    }
    uVar4 = (int)pvVar5 - 0x10b179;
    if (uVar3 != uVar4) {
      pcVar2 = smprintf("mu_queue_get() returned bad value; want %d, got %d",(ulong)uVar3,
                        (ulong)uVar4);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/mu_wait_test.c"
                     ,0x85,pcVar2);
    }
    uVar3 = uVar3 + 3;
  } while (uVar3 != 300000);
  return;
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}